

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O0

void __thiscall
dap::ResponseOrError<dap::StackTraceResponse>::~ResponseOrError
          (ResponseOrError<dap::StackTraceResponse> *this)

{
  ResponseOrError<dap::StackTraceResponse> *this_local;
  
  Error::~Error(&this->error);
  StackTraceResponse::~StackTraceResponse(&this->response);
  return;
}

Assistant:

inline ResponseOrError() = default;